

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O2

size_t stbds_hash_bytes(void *p,size_t len,size_t seed)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uchar *d;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (len == 8) {
    uVar3 = ((ulong)*(uint *)((long)p + 4) << 0x20 | (long)*p) ^ seed;
    uVar3 = uVar3 * 0x200000 + ~uVar3;
    uVar3 = ((uVar3 << 0x28 | uVar3 >> 0x18) ^ uVar3) * 0x109;
    uVar3 = ((uVar3 << 0x32 | uVar3 >> 0xe) ^ seed ^ uVar3) * 0x15;
    uVar3 = (uVar3 << 0x24 | uVar3 >> 0x1c) ^ uVar3;
    return uVar3 * 0x2000000040000 + ~(uVar3 * 0x80000001);
  }
  if (len != 4) {
    uVar7 = seed ^ 0x736f6d6570736575;
    uVar4 = seed ^ 0x9b908d9e919b9092;
    uVar8 = seed ^ 0x6c7967656e657261;
    uVar2 = seed ^ 0x8b9a9b9d868b9a8c;
    uVar3 = 0;
    while (uVar3 + 8 <= len) {
      uVar6 = (long)*(int *)((long)p + uVar3) | (ulong)*(uint *)((long)p + uVar3 + 4) << 0x20;
      uVar2 = uVar2 ^ uVar6;
      uVar9 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar2 + uVar8;
      uVar7 = uVar7 + uVar4;
      uVar5 = (uVar4 << 0xd | uVar4 >> 0x33) ^ uVar7;
      uVar7 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar9;
      uVar4 = uVar2 + uVar8 + uVar5;
      uVar8 = uVar4 << 0x20 | uVar4 >> 0x20;
      uVar2 = (uVar9 << 0x15 | uVar9 >> 0x2b) ^ uVar7;
      uVar4 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
      uVar7 = uVar7 ^ uVar6;
      uVar3 = uVar3 + 8;
    }
    uVar5 = len << 0x38;
    switch(~uVar3 + len) {
    case 6:
      uVar5 = uVar5 | (ulong)*(byte *)((long)p + uVar3 + 6) << 0x30;
    case 5:
      uVar5 = uVar5 | (ulong)*(byte *)((long)p + uVar3 + 5) << 0x28;
    case 4:
      uVar5 = uVar5 | (ulong)*(byte *)((long)p + uVar3 + 4) << 0x20;
    case 3:
      uVar5 = uVar5 | (long)(int)((uint)*(byte *)((long)p + uVar3 + 3) << 0x18);
    case 2:
      uVar5 = uVar5 | (ulong)*(byte *)((long)p + uVar3 + 2) << 0x10;
    case 1:
      uVar5 = uVar5 | (ulong)*(byte *)((long)p + uVar3 + 1) << 8;
    case 0:
      uVar5 = uVar5 | *(byte *)((long)p + uVar3);
    default:
      uVar2 = uVar2 ^ uVar5;
      uVar6 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar2 + uVar8;
      uVar7 = uVar7 + uVar4;
      uVar9 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar6;
      uVar7 = (uVar4 << 0xd | uVar4 >> 0x33) ^ uVar7;
      uVar3 = uVar2 + uVar8 + uVar7;
      uVar2 = (uVar6 << 0x15 | uVar6 >> 0x2b) ^ uVar9;
      uVar4 = ((uVar3 << 0x20 | uVar3 >> 0x20) ^ 0xff) + uVar2;
      uVar8 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar4;
      uVar3 = (uVar7 << 0x11 | uVar7 >> 0x2f) ^ uVar3;
      uVar2 = (uVar9 ^ uVar5) + uVar3;
      uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar2;
      uVar4 = uVar4 + uVar3;
      return (uVar4 << 0x20 | uVar4 >> 0x20) ^ uVar4 ^
             (uVar3 << 0x11 | uVar3 >> 0x2f) ^ (uVar2 << 0x20 | uVar2 >> 0x20) + uVar8 ^
             (uVar8 << 0x15 | uVar8 >> 0x2b);
    }
  }
  uVar1 = *p ^ (uint)seed;
  uVar1 = (uVar1 >> 0x10 ^ uVar1 ^ 0x3d) * 9;
  uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d ^ (uint)seed;
  return (ulong)(uVar1 >> 0xf ^ uVar1) * 0x100000001 ^ seed;
}

Assistant:

size_t stbds_hash_bytes(void *p, size_t len, size_t seed)
{
#ifdef STBDS_SIPHASH_2_4
  return stbds_siphash_bytes(p,len,seed);
#else
  unsigned char *d = (unsigned char *) p;

  if (len == 4) {
    unsigned int hash = d[0] | (d[1] << 8) | (d[2] << 16) | (d[3] << 24);
    #if 0
    // HASH32-A  Bob Jenkin's hash function w/o large constants
    hash ^= seed;
    hash -= (hash<<6);
    hash ^= (hash>>17);
    hash -= (hash<<9);
    hash ^= seed;
    hash ^= (hash<<4);
    hash -= (hash<<3);
    hash ^= (hash<<10);
    hash ^= (hash>>15);
    #elif 1
    // HASH32-BB  Bob Jenkin's presumably-accidental version of Thomas Wang hash with rotates turned into shifts.
    // Note that converting these back to rotates makes it run a lot slower, presumably due to collisions, so I'm
    // not really sure what's going on.
    hash ^= seed;
    hash = (hash ^ 61) ^ (hash >> 16);
    hash = hash + (hash << 3);
    hash = hash ^ (hash >> 4);
    hash = hash * 0x27d4eb2d;
    hash ^= seed;
    hash = hash ^ (hash >> 15);
    #else  // HASH32-C   -  Murmur3
    hash ^= seed;
    hash *= 0xcc9e2d51;
    hash = (hash << 17) | (hash >> 15);
    hash *= 0x1b873593;
    hash ^= seed;
    hash = (hash << 19) | (hash >> 13);
    hash = hash*5 + 0xe6546b64;
    hash ^= hash >> 16;
    hash *= 0x85ebca6b;
    hash ^= seed;
    hash ^= hash >> 13;
    hash *= 0xc2b2ae35;
    hash ^= hash >> 16;
    #endif
    // Following statistics were measured on a Core i7-6700 @ 4.00Ghz, compiled with clang 7.0.1 -O2
    // Note that the larger tables have high variance as they were run fewer times
    //  HASH32-A   //  HASH32-BB  //  HASH32-C
    //    0.10ms   //    0.10ms   //    0.10ms :      2,000 inserts creating 2K table
    //    0.96ms   //    0.95ms   //    0.99ms :     20,000 inserts creating 20K table
    //   14.69ms   //   14.43ms   //   14.97ms :    200,000 inserts creating 200K table
    //  199.99ms   //  195.36ms   //  202.05ms :  2,000,000 inserts creating 2M table
    // 2234.84ms   // 2187.74ms   // 2240.38ms : 20,000,000 inserts creating 20M table
    //   55.68ms   //   53.72ms   //   57.31ms : 500,000 inserts & deletes in 2K table
    //   63.43ms   //   61.99ms   //   65.73ms : 500,000 inserts & deletes in 20K table
    //   80.04ms   //   77.96ms   //   81.83ms : 500,000 inserts & deletes in 200K table
    //  100.42ms   //   97.40ms   //  102.39ms : 500,000 inserts & deletes in 2M table
    //  119.71ms   //  120.59ms   //  121.63ms : 500,000 inserts & deletes in 20M table
    //  185.28ms   //  195.15ms   //  187.74ms : 500,000 inserts & deletes in 200M table
    //   15.58ms   //   14.79ms   //   15.52ms : 200,000 inserts creating 200K table with varying key spacing

    return (((size_t) hash << 16 << 16) | hash) ^ seed;
  } else if (len == 8 && sizeof(size_t) == 8) {
    size_t hash = d[0] | (d[1] << 8) | (d[2] << 16) | (d[3] << 24);
    hash |= (size_t) (d[4] | (d[5] << 8) | (d[6] << 16) | (d[7] << 24)) << 16 << 16; // avoid warning if size_t == 4
    hash ^= seed;
    hash = (~hash) + (hash << 21);
    hash ^= STBDS_ROTATE_RIGHT(hash,24);
    hash *= 265;
    hash ^= STBDS_ROTATE_RIGHT(hash,14);
    hash ^= seed;
    hash *= 21;
    hash ^= STBDS_ROTATE_RIGHT(hash,28);
    hash += (hash << 31);
    hash = (~hash) + (hash << 18);
    return hash;
  } else {
    return stbds_siphash_bytes(p,len,seed);
  }
#endif
}